

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_align_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::ArenaAlign_CeilPtr_Test::TestBody
          (ArenaAlign_CeilPtr_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  char p [129];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_120;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_118;
  char local_110 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [64];
  AssertHelperData local_c0;
  AssertHelperData local_80;
  
  memset(local_100,0,0x81);
  local_120._M_head_impl = local_100;
  local_118._M_head_impl = local_100;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_110,(char *)&local_118,(char **)"align_64.Ceil(p + 0)");
  if (local_110[0] == '\0') {
    testing::Message::Message((Message *)&local_118);
    if (local_108 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_108->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x98,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,local_108);
  }
  local_120._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0;
  local_118._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_110,(char *)&local_118,(char **)"align_64.Ceil(p + 1)");
  if (local_110[0] == '\0') {
    testing::Message::Message((Message *)&local_118);
    if (local_108 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_108->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x99,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    if ((AssertHelperData *)local_118._M_head_impl != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,local_108);
  }
  local_120._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0;
  local_118._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_110,(char *)&local_118,(char **)"align_64.Ceil(p + 63)");
  if (local_110[0] == '\0') {
    testing::Message::Message((Message *)&local_118);
    if (local_108 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_108->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x9a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    if ((AssertHelperData *)local_118._M_head_impl != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,local_108);
  }
  local_120._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0;
  local_118._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_110,(char *)&local_118,(char **)"align_64.Ceil(p + 64)");
  if (local_110[0] == '\0') {
    testing::Message::Message((Message *)&local_118);
    if (local_108 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_108->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x9b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    if ((AssertHelperData *)local_118._M_head_impl != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,local_108);
  }
  local_120._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80;
  local_118._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_110,(char *)&local_118,(char **)"align_64.Ceil(p + 65)");
  if (local_110[0] == '\0') {
    testing::Message::Message((Message *)&local_118);
    if (local_108 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_108->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x9c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    if ((AssertHelperData *)local_118._M_head_impl != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,local_108);
  }
  local_120._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80;
  local_118._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_110,(char *)&local_118,(char **)"align_64.Ceil(p + 127)");
  if (local_110[0] == '\0') {
    testing::Message::Message((Message *)&local_118);
    if (local_108 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_108->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x9d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    if ((AssertHelperData *)local_118._M_head_impl != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,local_108);
  }
  local_120._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80;
  local_118._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_110,(char *)&local_118,(char **)"align_64.Ceil(p + 128)");
  if (local_110[0] == '\0') {
    testing::Message::Message((Message *)&local_118);
    if (local_108 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_108->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x9e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    if ((AssertHelperData *)local_118._M_head_impl != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,local_108);
  }
  return;
}

Assistant:

TEST(ArenaAlign, CeilPtr) {
  alignas(64) char p[129] = {0};
  auto align_64 = ArenaAlignAs(64);
  EXPECT_THAT(align_64.Ceil(p + 0), Eq(p));
  EXPECT_THAT(align_64.Ceil(p + 1), Eq(p + 64));
  EXPECT_THAT(align_64.Ceil(p + 63), Eq(p + 64));
  EXPECT_THAT(align_64.Ceil(p + 64), Eq(p + 64));
  EXPECT_THAT(align_64.Ceil(p + 65), Eq(p + 128));
  EXPECT_THAT(align_64.Ceil(p + 127), Eq(p + 128));
  EXPECT_THAT(align_64.Ceil(p + 128), Eq(p + 128));
}